

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

void __thiscall
QHttp2ProtocolHandler::handleHeadersReceived
          (QHttp2ProtocolHandler *this,HttpHeader *headers,bool endStream)

{
  QHttpNetworkReplyPrivate *pQVar1;
  QByteArrayView after;
  bool bVar2;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar3;
  QHttpNetworkReplyPrivate *pQVar4;
  QHttp2ProtocolHandler *pQVar5;
  ulong uVar6;
  QHttpNetworkRequestPrivate *pQVar7;
  QNonContiguousByteDevice *pQVar8;
  byte in_DL;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  QNonContiguousByteDevice *byteDevice;
  qlonglong length;
  QByteArray *name;
  HeaderField *pair;
  HttpHeader *__range1;
  int statusCode;
  QHttpNetworkReplyPrivate *httpReplyPrivate;
  QHttpNetworkRequest *httpRequest;
  QHttpNetworkReply *httpReply;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *requestPair;
  QString errorString;
  QByteArrayView binder;
  bool ok;
  QByteArrayView value;
  const_iterator __end1;
  const_iterator __begin1;
  QHttp2Stream *stream;
  ParseRedirectResult result;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  QHttpNetworkConnectionPrivate *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  ConnectionType in_stack_fffffffffffffe3c;
  QHttpNetworkReplyPrivate *in_stack_fffffffffffffe40;
  QHttpNetworkReplyPrivate *in_stack_fffffffffffffe48;
  QHttp2ProtocolHandler *in_stack_fffffffffffffe50;
  ConnectionType connectionType;
  QHttpNetworkReplyPrivate *in_stack_fffffffffffffe58;
  QHttpNetworkReplyPrivate *in_stack_fffffffffffffe60;
  QHttpNetworkReplyPrivate *in_stack_fffffffffffffe68;
  QHttpNetworkReply *in_stack_fffffffffffffe78;
  qlonglong in_stack_fffffffffffffe88;
  Http2Error errorCode;
  QByteArrayView in_stack_fffffffffffffe90;
  QHttp2Stream *stream_00;
  int local_144;
  undefined1 local_70 [24];
  QByteArrayView local_58;
  char *local_48;
  undefined8 local_40;
  undefined8 local_38;
  HeaderField *local_30;
  __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
  local_28;
  QHttp2Stream *local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::sender();
  local_20 = qobject_cast<QHttp2Stream*>((QObject *)0x2d2ce1);
  ppVar3 = QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::operator[]
                     ((QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *
                      )in_stack_fffffffffffffe40,
                      (QHttp2Stream **)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                     );
  pQVar1 = (QHttpNetworkReplyPrivate *)ppVar3->second;
  pQVar4 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2d2d5c);
  local_144 = 0;
  local_28._M_current = (HeaderField *)0xaaaaaaaaaaaaaaaa;
  local_28._M_current =
       (HeaderField *)
       std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::begin
                 ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
                  in_stack_fffffffffffffe30);
  local_30 = (HeaderField *)0xaaaaaaaaaaaaaaaa;
  local_30 = (HeaderField *)
             std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::end
                       ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
                        in_stack_fffffffffffffe30);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
                        *)in_stack_fffffffffffffe30,
                       (__normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    errorCode = (Http2Error)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    stream_00 = (QHttp2Stream *)in_stack_fffffffffffffe90.m_data;
    if (!bVar2) break;
    pQVar5 = (QHttp2ProtocolHandler *)
             __gnu_cxx::
             __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
             ::operator*(&local_28);
    local_40 = 0xaaaaaaaaaaaaaaaa;
    local_38 = 0xaaaaaaaaaaaaaaaa;
    QByteArrayView::QByteArrayView<QByteArray,_true>
              ((QByteArrayView *)in_stack_fffffffffffffe40,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    local_48 = ":status";
    bVar2 = ::operator==((QByteArray *)in_stack_fffffffffffffe40,
                         (char **)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    if (bVar2) {
      local_58 = QByteArrayView::left
                           ((QByteArrayView *)in_stack_fffffffffffffe48,
                            (qsizetype)in_stack_fffffffffffffe40);
      local_144 = QByteArrayView::toInt
                            ((QByteArrayView *)
                             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                             (bool *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      QHttpNetworkReply::setStatusCode
                ((QHttpNetworkReply *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      *(int *)(*(long *)(in_RDI + 0x18) + 0x54) = local_144;
      in_stack_fffffffffffffe68 = pQVar1;
      in_stack_fffffffffffffe90 =
           QByteArrayView::mid((QByteArrayView *)in_stack_fffffffffffffe48,
                               (qsizetype)in_stack_fffffffffffffe58,
                               (qsizetype)in_stack_fffffffffffffe50);
      QString::fromLatin1((QByteArrayView *)local_70);
      QHttpNetworkReply::setReasonPhrase
                ((QHttpNetworkReply *)in_stack_fffffffffffffe30,
                 (QString *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      QString::~QString((QString *)0x2d2f67);
    }
    else {
      bVar2 = ::operator==((QByteArray *)in_stack_fffffffffffffe40,
                           (char **)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      if (bVar2) {
        in_stack_fffffffffffffe58 = pQVar1;
        QByteArrayView::at((QByteArrayView *)in_stack_fffffffffffffe30,
                           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        QHttpNetworkReply::setMajorVersion
                  ((QHttpNetworkReply *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        in_stack_fffffffffffffe60 = pQVar1;
        QByteArrayView::at((QByteArrayView *)in_stack_fffffffffffffe30,
                           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        QHttpNetworkReply::setMinorVersion
                  ((QHttpNetworkReply *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      }
      else {
        bVar2 = ::operator==((QByteArray *)in_stack_fffffffffffffe40,
                             (char **)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38))
        ;
        if (bVar2) {
          in_stack_fffffffffffffe88 =
               QByteArrayView::toLongLong
                         ((QByteArrayView *)
                          CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          (bool *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        }
        else {
          bVar2 = ::operator==((QByteArray *)in_stack_fffffffffffffe40,
                               (char **)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38
                                                ));
          if (bVar2) {
            QByteArrayView::QByteArrayView<2ul>
                      ((QByteArrayView *)in_stack_fffffffffffffe40,
                       (char (*) [2])CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          }
          else {
            QByteArrayView::QByteArrayView<3ul>
                      ((QByteArrayView *)in_stack_fffffffffffffe40,
                       (char (*) [3])CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          }
          in_stack_fffffffffffffe48 = pQVar1;
          QByteArray::QByteArray
                    ((QByteArray *)in_stack_fffffffffffffe30,
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          after.m_data = (storage_type *)in_stack_fffffffffffffe78;
          after.m_size = in_RDI;
          QByteArray::replace((QByteArray *)
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                              (char)((ulong)in_stack_fffffffffffffe68 >> 0x38),after);
          QHttpNetworkReply::appendHeaderField
                    ((QHttpNetworkReply *)in_stack_fffffffffffffe40,
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     (QByteArray *)in_stack_fffffffffffffe30);
          QByteArray::~QByteArray((QByteArray *)0x2d3166);
          in_stack_fffffffffffffe50 = pQVar5;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
    ::operator++(&local_28);
  }
  if ((local_144 == 100) || ((0x65 < local_144 && (local_144 < 200)))) {
    QHttpNetworkReplyPrivate::clearHttpLayerInformation((QHttpNetworkReplyPrivate *)0x2d31b0);
  }
  else {
    bVar2 = QHttpNetworkReply::isHttpRedirect(local_144);
    if ((bVar2) &&
       (bVar2 = QHttpNetworkRequest::isFollowRedirects((QHttpNetworkRequest *)0x2d31d7), bVar2)) {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      QHttpNetworkConnectionPrivate::parseRedirectResponse(in_stack_fffffffffffffe78);
      if ((ConnectionType)local_10 == 0) {
        uVar6 = QUrl::isValid();
        if ((uVar6 & 1) != 0) {
          QHttpNetworkReply::setRedirectUrl
                    ((QHttpNetworkReply *)in_stack_fffffffffffffe30,
                     (QUrl *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        }
        bVar2 = false;
      }
      else {
        in_stack_fffffffffffffe30 =
             QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2d325c);
        in_stack_fffffffffffffe40 = *(QHttpNetworkReplyPrivate **)(in_RDI + 0x28);
        in_stack_fffffffffffffe3c = (ConnectionType)local_10;
        QString::QString((QString *)0x2d328a);
        QHttpNetworkConnectionPrivate::errorDetail
                  ((QHttpNetworkConnectionPrivate *)in_stack_fffffffffffffe60,
                   (NetworkError)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                   (QIODevice *)in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48);
        QString::~QString((QString *)0x2d32ba);
        finishStreamWithError
                  (in_stack_fffffffffffffe50,stream_00,
                   (NetworkError)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                   (QString *)in_stack_fffffffffffffe40);
        QHttp2Stream::sendRST_STREAM((QHttp2Stream *)in_stack_fffffffffffffe58,errorCode);
        bVar2 = true;
        QString::~QString((QString *)0x2d3302);
      }
      QHttpNetworkConnectionPrivate::ParseRedirectResult::~ParseRedirectResult
                ((ParseRedirectResult *)0x2d3341);
      if (bVar2) goto LAB_002d3431;
    }
    connectionType = (ConnectionType)((ulong)in_stack_fffffffffffffe50 >> 0x20);
    bVar2 = QHttpNetworkReplyPrivate::isCompressed(in_stack_fffffffffffffe48);
    if ((bVar2) &&
       (pQVar7 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                           ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)
                            in_stack_fffffffffffffe30), (pQVar7->autoDecompress & 1U) != 0)) {
      QHttpNetworkReplyPrivate::removeAutoDecompressHeader(in_stack_fffffffffffffe40);
    }
    bVar2 = QHttpNetworkReply::isHttpRedirect(local_144);
    if ((bVar2) &&
       (pQVar8 = QHttpNetworkRequest::uploadByteDevice((QHttpNetworkRequest *)0x2d33ab),
       pQVar8 != (QNonContiguousByteDevice *)0x0)) {
      (**(code **)(*(long *)pQVar8 + 0x80))();
      pQVar4->totallyUploadedData = 0;
    }
    QMetaObject::invokeMethod<void(QHttpNetworkReply::*)()>
              ((ContextType *)in_stack_fffffffffffffe48,
               (offset_in_QHttpNetworkReply_to_subr *)in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe3c);
    if ((in_DL & 1) != 0) {
      finishStream((QHttp2ProtocolHandler *)in_stack_fffffffffffffe58,stream_00,connectionType);
    }
  }
LAB_002d3431:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::handleHeadersReceived(const HPack::HttpHeader &headers, bool endStream)
{
    QHttp2Stream *stream = qobject_cast<QHttp2Stream *>(sender());
    auto &requestPair = requestReplyPairs[stream];
    auto *httpReply = requestPair.second;
    auto &httpRequest = requestPair.first;
    Q_ASSERT(httpReply || stream->state() == QHttp2Stream::State::ReservedRemote);

    auto *httpReplyPrivate = httpReply->d_func();

    // For HTTP/1 'location' is handled (and redirect URL set) when a protocol
    // handler emits channel->allDone(). Http/2 protocol handler never emits
    // allDone, since we have many requests multiplexed in one channel at any
    // moment and we are probably not done yet. So we extract url and set it
    // here, if needed.
    int statusCode = 0;
    for (const auto &pair : headers) {
        const auto &name = pair.name;
        const auto value = QByteArrayView(pair.value);

        // TODO: part of this code copies what SPDY protocol handler does when
        // processing headers. Binary nature of HTTP/2 and SPDY saves us a lot
        // of parsing and related errors/bugs, but it would be nice to have
        // more detailed validation of headers.
        if (name == ":status") {
            statusCode = value.left(3).toInt();
            httpReply->setStatusCode(statusCode);
            m_channel->lastStatus = statusCode; // Mostly useless for http/2, needed for auth
            httpReply->setReasonPhrase(QString::fromLatin1(value.mid(4)));
        } else if (name == ":version") {
            httpReply->setMajorVersion(value.at(5) - '0');
            httpReply->setMinorVersion(value.at(7) - '0');
        } else if (name == "content-length") {
            bool ok = false;
            const qlonglong length = value.toLongLong(&ok);
            if (ok)
                httpReply->setContentLength(length);
        } else {
            const auto binder = name == "set-cookie" ? QByteArrayView("\n") : QByteArrayView(", ");
            httpReply->appendHeaderField(name, QByteArray(pair.value).replace('\0', binder));
        }
    }

    // Discard all informational (1xx) replies with the exception of 101.
    // Also see RFC 9110 (Chapter 15.2)
    if (statusCode == 100 || (102 <= statusCode && statusCode <= 199)) {
        httpReplyPrivate->clearHttpLayerInformation();
        return;
    }

    if (QHttpNetworkReply::isHttpRedirect(statusCode) && httpRequest.isFollowRedirects()) {
        QHttpNetworkConnectionPrivate::ParseRedirectResult
                result = QHttpNetworkConnectionPrivate::parseRedirectResponse(httpReply);
        if (result.errorCode != QNetworkReply::NoError) {
            auto errorString = m_connection->d_func()->errorDetail(result.errorCode, m_socket);
            finishStreamWithError(stream, result.errorCode, errorString);
            stream->sendRST_STREAM(INTERNAL_ERROR);
            return;
        }

        if (result.redirectUrl.isValid())
            httpReply->setRedirectUrl(result.redirectUrl);
    }

    if (httpReplyPrivate->isCompressed() && httpRequest.d->autoDecompress)
        httpReplyPrivate->removeAutoDecompressHeader();

    if (QHttpNetworkReply::isHttpRedirect(statusCode)) {
        // Note: This status code can trigger uploadByteDevice->reset() in
        // QHttpNetworkConnectionChannel::handleStatus. Alas, we have no single
        // request/reply, we multiplex several requests and thus we never simply
        // call 'handleStatus'. If we have a byte-device - we try to reset it
        // here, we don't (and can't) handle any error during reset operation.
        if (auto *byteDevice = httpRequest.uploadByteDevice()) {
            byteDevice->reset();
            httpReplyPrivate->totallyUploadedData = 0;
        }
    }

    QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::headerChanged, Qt::QueuedConnection);
    if (endStream)
        finishStream(stream, Qt::QueuedConnection);
}